

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

QRegion __thiscall
QHeaderView::visualRegionForSelection(QHeaderView *this,QItemSelection *selection)

{
  bool bVar1;
  int iVar2;
  int aheight;
  QHeaderViewPrivate *pQVar3;
  QRegionData *in_RDI;
  long in_FS_OFFSET;
  int bottomPos;
  int topPos;
  int visual_1;
  int k_1;
  QItemSelectionRange *r_3;
  QItemSelection *__range2_1;
  int bottom;
  int top;
  QItemSelectionRange *r_2;
  QItemSelection *__range2;
  int logicalBottom;
  int logicalTop;
  int rightPos;
  int leftPos;
  int visual;
  int k;
  QItemSelectionRange *r_1;
  QItemSelection *__range3_1;
  int right;
  int left;
  QItemSelectionRange *r;
  QItemSelection *__range3;
  int logicalRight;
  int logicalLeft;
  int max;
  QHeaderViewPrivate *d;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  const_iterator __end3;
  const_iterator __begin3;
  int in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe38;
  undefined2 in_stack_fffffffffffffe3c;
  byte in_stack_fffffffffffffe3e;
  byte in_stack_fffffffffffffe3f;
  int in_stack_fffffffffffffe44;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  uint in_stack_fffffffffffffe54;
  QRegionData *this_00;
  int local_184;
  int local_170;
  int local_16c;
  int local_158;
  int local_154;
  int local_144;
  int local_130;
  int local_12c;
  int local_114;
  int local_110;
  undefined1 local_e8 [40];
  QItemSelectionRange *local_c0;
  const_iterator local_b8;
  const_iterator local_b0 [4];
  QItemSelectionRange *local_90;
  const_iterator local_88;
  const_iterator local_80;
  undefined1 local_78 [40];
  QItemSelectionRange *local_50;
  const_iterator local_48;
  const_iterator local_40 [4];
  QItemSelectionRange *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar3 = d_func((QHeaderView *)0x840933);
  local_16c = QHeaderViewPrivate::modelSectionCount
                        ((QHeaderViewPrivate *)
                         CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  if (pQVar3->orientation == Horizontal) {
    local_114 = 0;
    bVar1 = QList<int>::empty((QList<int> *)0x840991);
    if (bVar1) {
      local_10.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_10 = QList<QItemSelectionRange>::begin
                           ((QList<QItemSelectionRange> *)
                            CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      local_18.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_18 = QList<QItemSelectionRange>::end
                           ((QList<QItemSelectionRange> *)
                            CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      local_110 = local_16c;
      while( true ) {
        local_20 = local_18.i;
        bVar1 = QList<QItemSelectionRange>::const_iterator::operator!=(&local_10,local_18);
        if (!bVar1) break;
        QList<QItemSelectionRange>::const_iterator::operator*(&local_10);
        QItemSelectionRange::parent
                  ((QItemSelectionRange *)
                   CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        bVar1 = QModelIndex::isValid
                          ((QModelIndex *)
                           CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        in_stack_fffffffffffffe54 = CONCAT13(1,(int3)in_stack_fffffffffffffe54);
        if (!bVar1) {
          bVar1 = QItemSelectionRange::isValid
                            ((QItemSelectionRange *)
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          in_stack_fffffffffffffe54 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe54) ^ 0xff000000;
        }
        if ((in_stack_fffffffffffffe54 & 0x1000000) == 0) {
          iVar2 = QItemSelectionRange::left((QItemSelectionRange *)0x840ab4);
          if (iVar2 < local_110) {
            local_110 = QItemSelectionRange::left((QItemSelectionRange *)0x840aca);
          }
          iVar2 = QItemSelectionRange::right((QItemSelectionRange *)0x840ade);
          if (local_114 < iVar2) {
            local_114 = QItemSelectionRange::right((QItemSelectionRange *)0x840af4);
          }
        }
        QList<QItemSelectionRange>::const_iterator::operator++(&local_10);
      }
    }
    else {
      local_130 = 0;
      local_40[0].i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_40[0] = QList<QItemSelectionRange>::begin
                              ((QList<QItemSelectionRange> *)
                               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      local_48.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_48 = QList<QItemSelectionRange>::end
                           ((QList<QItemSelectionRange> *)
                            CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      local_12c = local_16c;
      while( true ) {
        local_50 = local_48.i;
        bVar1 = QList<QItemSelectionRange>::const_iterator::operator!=(local_40,local_48);
        if (!bVar1) break;
        QList<QItemSelectionRange>::const_iterator::operator*(local_40);
        QItemSelectionRange::parent
                  ((QItemSelectionRange *)
                   CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        bVar1 = QModelIndex::isValid
                          ((QModelIndex *)
                           CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        in_stack_fffffffffffffe54 =
             CONCAT13((char)(in_stack_fffffffffffffe54 >> 0x18),
                      CONCAT12(1,(short)in_stack_fffffffffffffe54));
        if (!bVar1) {
          bVar1 = QItemSelectionRange::isValid
                            ((QItemSelectionRange *)
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          in_stack_fffffffffffffe54 =
               CONCAT13((char)(in_stack_fffffffffffffe54 >> 0x18),
                        CONCAT12(bVar1,(short)in_stack_fffffffffffffe54)) ^ 0xff0000;
        }
        if ((in_stack_fffffffffffffe54 & 0x10000) == 0) {
          for (local_144 = QItemSelectionRange::left((QItemSelectionRange *)0x840c4a);
              iVar2 = QItemSelectionRange::right((QItemSelectionRange *)0x840c69),
              local_144 <= iVar2; local_144 = local_144 + 1) {
            iVar2 = visualIndex((QHeaderView *)this_00,in_stack_fffffffffffffe54);
            if (iVar2 != -1) {
              if (iVar2 < local_12c) {
                local_12c = iVar2;
              }
              if (local_130 < iVar2) {
                local_130 = iVar2;
              }
            }
          }
        }
        QList<QItemSelectionRange>::const_iterator::operator++(local_40);
      }
      local_110 = logicalIndex((QHeaderView *)
                               CONCAT17(in_stack_fffffffffffffe3f,
                                        CONCAT16(in_stack_fffffffffffffe3e,
                                                 CONCAT24(in_stack_fffffffffffffe3c,
                                                          in_stack_fffffffffffffe38))),
                               in_stack_fffffffffffffe34);
      local_114 = logicalIndex((QHeaderView *)
                               CONCAT17(in_stack_fffffffffffffe3f,
                                        CONCAT16(in_stack_fffffffffffffe3e,
                                                 CONCAT24(in_stack_fffffffffffffe3c,
                                                          in_stack_fffffffffffffe38))),
                               in_stack_fffffffffffffe34);
    }
    if (((local_110 < 0) ||
        (iVar2 = count((QHeaderView *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30))
        , iVar2 <= local_110)) ||
       ((local_114 < 0 ||
        (iVar2 = count((QHeaderView *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30))
        , iVar2 <= local_114)))) {
      QRegion::QRegion((QRegion *)this_00);
    }
    else {
      sectionViewportPosition((QHeaderView *)this_00,in_stack_fffffffffffffe54);
      sectionViewportPosition((QHeaderView *)this_00,in_stack_fffffffffffffe54);
      sectionSize((QHeaderView *)CONCAT44(local_110,local_114),in_stack_fffffffffffffe44);
      QWidget::height((QWidget *)0x840e06);
      QRect::QRect((QRect *)CONCAT17(in_stack_fffffffffffffe3f,
                                     CONCAT16(in_stack_fffffffffffffe3e,
                                              CONCAT24(in_stack_fffffffffffffe3c,
                                                       in_stack_fffffffffffffe38))),
                   in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                   in_stack_fffffffffffffe28);
      QRegion::QRegion((QRegion *)this_00,(QRect *)local_78,Rectangle);
    }
  }
  else {
    local_158 = 0;
    bVar1 = QList<int>::empty((QList<int> *)0x840e66);
    if (bVar1) {
      local_80.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_80 = QList<QItemSelectionRange>::begin
                           ((QList<QItemSelectionRange> *)
                            CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      local_88.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = QList<QItemSelectionRange>::end
                           ((QList<QItemSelectionRange> *)
                            CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      local_154 = local_16c;
      while( true ) {
        local_90 = local_88.i;
        bVar1 = QList<QItemSelectionRange>::const_iterator::operator!=(&local_80,local_88);
        if (!bVar1) break;
        QList<QItemSelectionRange>::const_iterator::operator*(&local_80);
        QItemSelectionRange::parent
                  ((QItemSelectionRange *)
                   CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        bVar1 = QModelIndex::isValid
                          ((QModelIndex *)
                           CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        in_stack_fffffffffffffe3f = 1;
        if (!bVar1) {
          bVar1 = QItemSelectionRange::isValid
                            ((QItemSelectionRange *)
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          in_stack_fffffffffffffe3f = bVar1 ^ 0xff;
        }
        if ((in_stack_fffffffffffffe3f & 1) == 0) {
          iVar2 = QItemSelectionRange::top((QItemSelectionRange *)0x840f6e);
          if (iVar2 < local_154) {
            local_154 = QItemSelectionRange::top((QItemSelectionRange *)0x840f81);
          }
          iVar2 = QItemSelectionRange::bottom((QItemSelectionRange *)0x840f92);
          if (local_158 < iVar2) {
            local_158 = QItemSelectionRange::bottom((QItemSelectionRange *)0x840fa5);
          }
        }
        QList<QItemSelectionRange>::const_iterator::operator++(&local_80);
      }
    }
    else {
      local_170 = 0;
      local_b0[0].i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_b0[0] = QList<QItemSelectionRange>::begin
                              ((QList<QItemSelectionRange> *)
                               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      local_b8.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8 = QList<QItemSelectionRange>::end
                           ((QList<QItemSelectionRange> *)
                            CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      while( true ) {
        local_c0 = local_b8.i;
        bVar1 = QList<QItemSelectionRange>::const_iterator::operator!=(local_b0,local_b8);
        if (!bVar1) break;
        QList<QItemSelectionRange>::const_iterator::operator*(local_b0);
        QItemSelectionRange::parent
                  ((QItemSelectionRange *)
                   CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        bVar1 = QModelIndex::isValid
                          ((QModelIndex *)
                           CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        in_stack_fffffffffffffe3e = 1;
        if (!bVar1) {
          bVar1 = QItemSelectionRange::isValid
                            ((QItemSelectionRange *)
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          in_stack_fffffffffffffe3e = bVar1 ^ 0xff;
        }
        if ((in_stack_fffffffffffffe3e & 1) == 0) {
          local_184 = QItemSelectionRange::top((QItemSelectionRange *)0x8410d7);
          while (in_stack_fffffffffffffe38 = local_184,
                iVar2 = QItemSelectionRange::bottom((QItemSelectionRange *)0x8410ed),
                in_stack_fffffffffffffe38 <= iVar2) {
            iVar2 = visualIndex((QHeaderView *)this_00,in_stack_fffffffffffffe54);
            if (iVar2 != -1) {
              if (iVar2 < local_16c) {
                local_16c = iVar2;
              }
              if (local_170 < iVar2) {
                local_170 = iVar2;
              }
            }
            local_184 = local_184 + 1;
          }
        }
        QList<QItemSelectionRange>::const_iterator::operator++(local_b0);
      }
      local_154 = logicalIndex((QHeaderView *)
                               CONCAT17(in_stack_fffffffffffffe3f,
                                        CONCAT16(in_stack_fffffffffffffe3e,
                                                 CONCAT24(in_stack_fffffffffffffe3c,
                                                          in_stack_fffffffffffffe38))),
                               in_stack_fffffffffffffe34);
      local_158 = logicalIndex((QHeaderView *)
                               CONCAT17(in_stack_fffffffffffffe3f,
                                        CONCAT16(in_stack_fffffffffffffe3e,
                                                 CONCAT24(in_stack_fffffffffffffe3c,
                                                          in_stack_fffffffffffffe38))),
                               in_stack_fffffffffffffe34);
    }
    if ((((local_154 < 0) ||
         (iVar2 = count((QHeaderView *)CONCAT44(local_154,in_stack_fffffffffffffe30)),
         iVar2 <= local_154)) || (local_158 < 0)) ||
       (iVar2 = count((QHeaderView *)CONCAT44(local_154,local_158)), iVar2 <= local_158)) {
      QRegion::QRegion((QRegion *)this_00);
    }
    else {
      iVar2 = sectionViewportPosition((QHeaderView *)this_00,in_stack_fffffffffffffe54);
      aheight = sectionViewportPosition((QHeaderView *)this_00,in_stack_fffffffffffffe54);
      sectionSize((QHeaderView *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                  in_stack_fffffffffffffe44);
      QWidget::width((QWidget *)0x84123b);
      QRect::QRect((QRect *)CONCAT17(in_stack_fffffffffffffe3f,
                                     CONCAT16(in_stack_fffffffffffffe3e,
                                              CONCAT24(in_stack_fffffffffffffe3c,
                                                       in_stack_fffffffffffffe38))),local_154,
                   local_158,iVar2,aheight);
      QRegion::QRegion((QRegion *)this_00,(QRect *)local_e8,Rectangle);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QRegion)in_RDI;
}

Assistant:

QRegion QHeaderView::visualRegionForSelection(const QItemSelection &selection) const
{
    Q_D(const QHeaderView);
    const int max = d->modelSectionCount();

    if (d->orientation == Qt::Horizontal) {
        int logicalLeft = max;
        int logicalRight = 0;

        if (d->visualIndices.empty()) {
            // If no reordered sections, skip redundant visual-to-logical transformations
            for (const auto &r : selection) {
                if (r.parent().isValid() || !r.isValid())
                    continue; // we only know about toplevel items and we don't want invalid ranges
                if (r.left() < logicalLeft)
                    logicalLeft = r.left();
                if (r.right() > logicalRight)
                    logicalRight = r.right();
            }
        } else {
            int left = max;
            int right = 0;
            for (const auto &r : selection) {
                if (r.parent().isValid() || !r.isValid())
                    continue; // we only know about toplevel items and we don't want invalid ranges
                for (int k = r.left(); k <= r.right(); ++k) {
                    int visual = visualIndex(k);
                    if (visual == -1)   // in some cases users may change the selections
                        continue;       // before we have a chance to do the layout
                    if (visual < left)
                        left = visual;
                    if (visual > right)
                        right = visual;
                }
            }
            logicalLeft = logicalIndex(left);
            logicalRight = logicalIndex(right);
        }

        if (logicalLeft < 0  || logicalLeft >= count() ||
            logicalRight < 0 || logicalRight >= count())
            return QRegion();

        int leftPos = sectionViewportPosition(logicalLeft);
        int rightPos = sectionViewportPosition(logicalRight);
        rightPos += sectionSize(logicalRight);
        return QRect(leftPos, 0, rightPos - leftPos, height());
    }
    // orientation() == Qt::Vertical
    int logicalTop = max;
    int logicalBottom = 0;

    if (d->visualIndices.empty()) {
        // If no reordered sections, skip redundant visual-to-logical transformations
        for (const auto &r : selection) {
            if (r.parent().isValid() || !r.isValid())
                continue; // we only know about toplevel items and we don't want invalid ranges
            if (r.top() < logicalTop)
                logicalTop = r.top();
            if (r.bottom() > logicalBottom)
                logicalBottom = r.bottom();
        }
    } else {
        int top = max;
        int bottom = 0;

        for (const auto &r : selection) {
            if (r.parent().isValid() || !r.isValid())
                continue; // we only know about toplevel items and we don't want invalid ranges
            for (int k = r.top(); k <= r.bottom(); ++k) {
                int visual = visualIndex(k);
                if (visual == -1)   // in some cases users may change the selections
                    continue;       // before we have a chance to do the layout
                if (visual < top)
                    top = visual;
                if (visual > bottom)
                    bottom = visual;
            }
        }

        logicalTop = logicalIndex(top);
        logicalBottom = logicalIndex(bottom);
    }

    if (logicalTop < 0 || logicalTop >= count() ||
        logicalBottom < 0 || logicalBottom >= count())
        return QRegion();

    int topPos = sectionViewportPosition(logicalTop);
    int bottomPos = sectionViewportPosition(logicalBottom) + sectionSize(logicalBottom);

    return QRect(0, topPos, width(), bottomPos - topPos);
}